

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json_decoder.hpp
# Opt level: O3

basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> __thiscall
jsoncons::
json_decoder<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>,_std::allocator<char>_>
::get_result(json_decoder<jsoncons::basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>,_std::allocator<char>_>
             *this)

{
  assertion_error *this_00;
  undefined8 extraout_RDX;
  long in_RSI;
  basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> bVar1;
  string local_38;
  
  if (*(char *)(in_RSI + 0x78) != '\0') {
    *(undefined1 *)(in_RSI + 0x78) = 0;
    basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>::uninitialized_move
              ((basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *)this,
               (basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_> *)
               (in_RSI + 0x10));
    bVar1.field_0.int64_.val_ = extraout_RDX;
    bVar1.field_0._0_8_ = this;
    return (basic_json<char,_jsoncons::order_preserving_policy,_std::allocator<char>_>)bVar1.field_0
    ;
  }
  this_00 = (assertion_error *)__cxa_allocate_exception(0x10);
  local_38._M_dataplus._M_p = (pointer)&local_38.field_2;
  std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_38,"assertion \'is_valid_\' failed at  <> :0","");
  assertion_error::assertion_error(this_00,&local_38);
  __cxa_throw(this_00,&assertion_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

Json get_result()
    {
        JSONCONS_ASSERT(is_valid_);
        is_valid_ = false;
        return std::move(result_);
    }